

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void save_cursor(Terminal *term,_Bool save)

{
  wchar_t wVar1;
  optionalrgb oVar2;
  unsigned_long uVar3;
  truecolour tVar4;
  undefined4 uVar5;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,save) != 0) {
    term->savecurs = term->curs;
    term->save_attr = term->curr_attr;
    term->save_truecolour = term->curr_truecolour;
    term->save_cset = term->cset;
    term->save_utf = term->utf;
    term->save_wnext = term->wrapnext;
    term->save_csattr = term->cset_attr[term->cset];
    term->save_sco_acs = term->sco_acs;
    return;
  }
  term->curs = term->savecurs;
  wVar1 = term->cols;
  if (wVar1 <= (term->curs).x) {
    (term->curs).x = wVar1 + L'\xffffffff';
  }
  if (term->rows <= (term->curs).y) {
    (term->curs).y = term->rows + L'\xffffffff';
  }
  term->curr_attr = term->save_attr;
  term->curr_truecolour = term->save_truecolour;
  term->cset = term->save_cset;
  term->utf = term->save_utf;
  term->wrapnext = term->save_wnext;
  if ((term->save_wnext == true) && ((term->curs).x < wVar1 + L'\xffffffff')) {
    term->wrapnext = false;
  }
  term->cset_attr[term->save_cset] = term->save_csattr;
  term->sco_acs = term->save_sco_acs;
  uVar3 = (term->basic_erase_char).attr;
  tVar4 = (term->basic_erase_char).truecolour;
  wVar1 = (term->basic_erase_char).cc_next;
  uVar5 = *(undefined4 *)&(term->basic_erase_char).field_0x1c;
  (term->erase_char).chr = (term->basic_erase_char).chr;
  (term->erase_char).attr = uVar3;
  (term->erase_char).truecolour = tVar4;
  (term->erase_char).cc_next = wVar1;
  *(undefined4 *)&(term->erase_char).field_0x1c = uVar5;
  if (term->use_bce == true) {
    oVar2 = (term->curr_truecolour).bg;
    (term->erase_char).attr = (ulong)(uint)(term->curr_attr & 0x3ffff);
    (term->erase_char).truecolour.bg = oVar2;
  }
  return;
}

Assistant:

static void save_cursor(Terminal *term, bool save)
{
    if (save) {
        term->savecurs = term->curs;
        term->save_attr = term->curr_attr;
        term->save_truecolour = term->curr_truecolour;
        term->save_cset = term->cset;
        term->save_utf = term->utf;
        term->save_wnext = term->wrapnext;
        term->save_csattr = term->cset_attr[term->cset];
        term->save_sco_acs = term->sco_acs;
    } else {
        term->curs = term->savecurs;
        /* Make sure the window hasn't shrunk since the save */
        if (term->curs.x >= term->cols)
            term->curs.x = term->cols - 1;
        if (term->curs.y >= term->rows)
            term->curs.y = term->rows - 1;

        term->curr_attr = term->save_attr;
        term->curr_truecolour = term->save_truecolour;
        term->cset = term->save_cset;
        term->utf = term->save_utf;
        term->wrapnext = term->save_wnext;
        /*
         * wrapnext might reset to False if the x position is no
         * longer at the rightmost edge.
         */
        if (term->wrapnext && term->curs.x < term->cols-1)
            term->wrapnext = false;
        term->cset_attr[term->cset] = term->save_csattr;
        term->sco_acs = term->save_sco_acs;
        set_erase_char(term);
    }
}